

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

ostream * operator<<(ostream *stream,buffer *buffer)

{
  ostream *poVar1;
  byte *pbVar2;
  
  poVar1 = std::operator<<(stream,"[");
  *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  for (pbVar2 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pbVar2 != (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    std::ostream::operator<<(stream,(uint)*pbVar2);
    if (pbVar2 != (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish + -1) {
      std::operator<<(stream,", ");
    }
  }
  poVar1 = std::operator<<(stream,"]");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const buffer& buffer)
{
    stream << "[" << std::hex;

    for(auto it = buffer.begin(); it != buffer.end(); ++it)
    {
        stream << static_cast<int>(*it);
        if(it != buffer.end() - 1)
        {
            stream << ", ";
        }
    }

    return stream << "]";
}